

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdatawidgetmapper.cpp
# Opt level: O0

void QDataWidgetMapper::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  SubmitPolicy SVar2;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long *in_RDI;
  void *_v_1;
  void *_v;
  bool _r;
  QDataWidgetMapper *_t;
  int in_stack_ffffffffffffffac;
  QDataWidgetMapper *in_stack_ffffffffffffffb0;
  QDataWidgetMapper *in_stack_ffffffffffffffc0;
  QModelIndex *in_stack_ffffffffffffffc8;
  QDataWidgetMapper *in_stack_ffffffffffffffd0;
  
  if (in_ESI == 0) {
    in_stack_ffffffffffffffb0 = (QDataWidgetMapper *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffffb0) {
    case (QDataWidgetMapper *)0x0:
      currentIndexChanged((QDataWidgetMapper *)0x871a8d,in_stack_ffffffffffffffac);
      break;
    case (QDataWidgetMapper *)0x1:
      revert(in_stack_ffffffffffffffb0);
      break;
    case (QDataWidgetMapper *)0x2:
      bVar1 = submit(in_stack_ffffffffffffffc0);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar1;
      }
      break;
    case (QDataWidgetMapper *)0x3:
      toFirst((QDataWidgetMapper *)0x871ad9);
      break;
    case (QDataWidgetMapper *)0x4:
      toLast(in_stack_ffffffffffffffb0);
      break;
    case (QDataWidgetMapper *)0x5:
      toNext(in_stack_ffffffffffffffb0);
      break;
    case (QDataWidgetMapper *)0x6:
      toPrevious(in_stack_ffffffffffffffb0);
      break;
    case (QDataWidgetMapper *)0x7:
      (**(code **)(*in_RDI + 0x60))(in_RDI,**(undefined4 **)(in_RCX + 8));
      break;
    case (QDataWidgetMapper *)0x8:
      setCurrentModelIndex(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  if ((in_ESI != 5) ||
     (bVar1 = QtMocHelpers::indexOfMethod<void(QDataWidgetMapper::*)(int)>
                        (in_RCX,(void **)currentIndexChanged,0,0), !bVar1)) {
    if (in_ESI == 1) {
      in_stack_ffffffffffffffc0 = *(QDataWidgetMapper **)in_RCX;
      if (in_EDX == 0) {
        SVar2 = currentIndex(in_stack_ffffffffffffffb0);
        *(SubmitPolicy *)in_stack_ffffffffffffffc0 = SVar2;
      }
      else if (in_EDX == 1) {
        SVar2 = orientation(in_stack_ffffffffffffffb0);
        *(SubmitPolicy *)in_stack_ffffffffffffffc0 = SVar2;
      }
      else if (in_EDX == 2) {
        SVar2 = submitPolicy(in_stack_ffffffffffffffb0);
        *(SubmitPolicy *)in_stack_ffffffffffffffc0 = SVar2;
      }
    }
    if (in_ESI == 2) {
      if (in_EDX == 0) {
        (**(code **)(*in_RDI + 0x60))(in_RDI,**(undefined4 **)in_RCX);
      }
      else {
        SVar2 = (SubmitPolicy)((ulong)*(undefined4 **)in_RCX >> 0x20);
        if (in_EDX == 1) {
          setOrientation(in_stack_ffffffffffffffc0,SVar2);
        }
        else if (in_EDX == 2) {
          setSubmitPolicy(in_stack_ffffffffffffffc0,SVar2);
        }
      }
    }
  }
  return;
}

Assistant:

void QDataWidgetMapper::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDataWidgetMapper *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentIndexChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->revert(); break;
        case 2: { bool _r = _t->submit();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 3: _t->toFirst(); break;
        case 4: _t->toLast(); break;
        case 5: _t->toNext(); break;
        case 6: _t->toPrevious(); break;
        case 7: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 8: _t->setCurrentModelIndex((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDataWidgetMapper::*)(int )>(_a, &QDataWidgetMapper::currentIndexChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 1: *reinterpret_cast<Qt::Orientation*>(_v) = _t->orientation(); break;
        case 2: *reinterpret_cast<SubmitPolicy*>(_v) = _t->submitPolicy(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setOrientation(*reinterpret_cast<Qt::Orientation*>(_v)); break;
        case 2: _t->setSubmitPolicy(*reinterpret_cast<SubmitPolicy*>(_v)); break;
        default: break;
        }
    }
}